

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

ScalarFunction * duckdb::AtanhFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_151;
  code *local_150;
  undefined8 local_148;
  code *local_140;
  code *local_138;
  LogicalType local_130 [24];
  LogicalType local_118 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_100;
  LogicalType local_e8 [24];
  BaseScalarFunction local_d0 [176];
  
  duckdb::LogicalType::LogicalType(local_118,DOUBLE);
  __l._M_len = 1;
  __l._M_array = local_118;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_100,__l,&local_151);
  duckdb::LogicalType::LogicalType(local_130,DOUBLE);
  local_148 = 0;
  local_150 = ScalarFunction::UnaryFunction<double,double,duckdb::AtanhOperator>;
  local_138 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_140 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_e8,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_e8);
  if (local_140 != (code *)0x0) {
    (*local_140)(&local_150,&local_150,3);
  }
  duckdb::LogicalType::~LogicalType(local_130);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_100);
  duckdb::LogicalType::~LogicalType(local_118);
  BaseScalarFunction::SetReturnsError(local_d0,&in_RDI->super_BaseScalarFunction);
  duckdb::BaseScalarFunction::~BaseScalarFunction(local_d0);
  return in_RDI;
}

Assistant:

ScalarFunction AtanhFun::GetFunction() {
	ScalarFunction function({LogicalType::DOUBLE}, LogicalType::DOUBLE,
	                        ScalarFunction::UnaryFunction<double, double, AtanhOperator>);
	BaseScalarFunction::SetReturnsError(function);
	return function;
}